

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_cursor.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::basic_cbor_cursor<jsoncons::bytes_source,_std::allocator<char>_>::read_next
          (basic_cbor_cursor<jsoncons::bytes_source,_std::allocator<char>_> *this,
          basic_json_visitor<char> *visitor,error_code *ec)

{
  bool bVar1;
  error_code *in_RDX;
  basic_json_visitor<char> *in_RDI;
  resource_wrapper wrapper;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  resource_wrapper *in_stack_ffffffffffffffd0;
  
  basic_cbor_cursor<jsoncons::bytes_source,std::allocator<char>>::read_next(jsoncons::
  basic_json_visitor<char>&,std::error_code&)::resource_wrapper::resource_wrapper(jsoncons::
  basic_item_event_visitor_to_json_visitor<char,std::allocator<char>>&,jsoncons::
  basic_json_visitor<char>__
            (in_stack_ffffffffffffffd0,
             (basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),in_RDI);
  basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::restart
            ((basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *)(in_RDI + 1));
  do {
    bVar1 = basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::stopped
                      ((basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *)
                       (in_RDI + 1));
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_>::parse
              ((basic_cbor_parser<jsoncons::bytes_source,_std::allocator<char>_> *)this,
               (item_event_visitor *)visitor,ec);
    bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
  } while (!bVar1);
  read_next::resource_wrapper::~resource_wrapper((resource_wrapper *)0x2a40c0);
  return;
}

Assistant:

void read_next(basic_json_visitor<char_type>& visitor, std::error_code& ec)
    {
        {
            struct resource_wrapper
            {
                basic_item_event_visitor_to_json_visitor<char_type,Allocator>& adaptor;
                basic_json_visitor<char_type>& original;

                resource_wrapper(basic_item_event_visitor_to_json_visitor<char_type,Allocator>& adaptor,
                                 basic_json_visitor<char_type>& visitor)
                    : adaptor(adaptor), original(adaptor.destination())
                {
                    adaptor.destination(visitor);
                }

                ~resource_wrapper()
                {
                    adaptor.destination(original);
                }
            } wrapper(cursor_handler_adaptor_, visitor);

            parser_.restart();
            while (!parser_.stopped())
            {
                parser_.parse(cursor_handler_adaptor_, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
            }
        }
    }